

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getDigits(char *zDate,char *zFormat,...)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  undefined8 *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  undefined8 *local_e0;
  undefined8 local_c8 [9];
  va_list ap;
  
  local_e0 = (undefined8 *)&stack0x00000008;
  uVar8 = 0x10;
  iVar2 = 0;
  do {
    cVar10 = *zFormat;
    bVar1 = zFormat[3];
    if (cVar10 == '0') {
      iVar5 = 0;
    }
    else {
      pbVar3 = (byte *)zDate + (ulong)(byte)(cVar10 - 0x31) + 1;
      cVar10 = cVar10 + -0x30;
      iVar5 = 0;
      pbVar4 = (byte *)zDate;
      do {
        zDate = (char *)pbVar4;
        if ((ulong)(byte)*zDate - 0x3a < 0xfffffffffffffff6) {
          iVar7 = 6;
          goto LAB_001c22d2;
        }
        iVar5 = (int)*zDate + iVar5 * 10 + -0x30;
        pbVar4 = (byte *)zDate + 1;
        cVar10 = cVar10 + -1;
        zDate = (char *)pbVar3;
      } while (cVar10 != '\0');
    }
    iVar7 = 6;
    if ((((char)(zFormat[1] + -0x30) <= iVar5) &&
        (iVar5 <= (int)(uint)(ushort)yy_reduce_ofst[(long)zFormat[2] + 0x12f])) &&
       ((bVar1 == 0 || (bVar1 == *zDate)))) {
      uVar9 = (ulong)uVar8;
      if (uVar9 < 0x29) {
        uVar8 = uVar8 + 8;
        puVar6 = (undefined8 *)((long)local_c8 + uVar9);
      }
      else {
        puVar6 = local_e0;
        local_e0 = local_e0 + 1;
      }
      *(int *)*puVar6 = iVar5;
      zDate = (char *)((byte *)zDate + 1);
      iVar2 = iVar2 + 1;
      zFormat = zFormat + 4;
      iVar7 = 0;
    }
LAB_001c22d2:
    if ((iVar7 != 0) || (bVar1 == 0)) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e     f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 9999 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}